

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

LY_ERR lyb_write_string(char *str,size_t str_len,uint8_t len_size,ly_out *out,lylyb_ctx *lybctx)

{
  bool bVar1;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_bool error;
  lylyb_ctx *lybctx_local;
  ly_out *out_local;
  size_t sStack_20;
  uint8_t len_size_local;
  size_t str_len_local;
  char *str_local;
  
  str_len_local = (size_t)str;
  if ((str == (char *)0x0) && (str_len_local = (long)"\t" + 1, str_len != 0)) {
    ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c",
           0x1a9);
    str_local._4_4_ = LY_EINT;
  }
  else {
    sStack_20 = str_len;
    if (str_len == 0) {
      sStack_20 = strlen((char *)str_len_local);
    }
    switch(len_size) {
    case '\x01':
      bVar1 = 0xff < sStack_20;
      break;
    case '\x02':
      bVar1 = 0xffff < sStack_20;
      break;
    default:
      bVar1 = true;
      break;
    case '\x04':
      bVar1 = 0xffffffff < sStack_20;
      break;
    case '\b':
      bVar1 = false;
    }
    if (bVar1) {
      ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c",
             0x1c1);
      str_local._4_4_ = LY_EINT;
    }
    else {
      str_local._4_4_ = lyb_write_number(sStack_20,(ulong)len_size,out,lybctx);
      if ((str_local._4_4_ == LY_SUCCESS) &&
         (str_local._4_4_ = lyb_write(out,(uint8_t *)str_len_local,sStack_20,lybctx),
         str_local._4_4_ == LY_SUCCESS)) {
        str_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return str_local._4_4_;
}

Assistant:

static LY_ERR
lyb_write_string(const char *str, size_t str_len, uint8_t len_size, struct ly_out *out, struct lylyb_ctx *lybctx)
{
    ly_bool error;

    if (!str) {
        str = "";
        LY_CHECK_ERR_RET(str_len, LOGINT(lybctx->ctx), LY_EINT);
    }

    if (!str_len) {
        str_len = strlen(str);
    }

    switch (len_size) {
    case sizeof(uint8_t):
        error = str_len > UINT8_MAX;
        break;
    case sizeof(uint16_t):
        error = str_len > UINT16_MAX;
        break;
    case sizeof(uint32_t):
        error = str_len > UINT32_MAX;
        break;
    case sizeof(uint64_t):
        error = 0;
        break;
    default:
        error = 1;
    }
    if (error) {
        LOGINT(lybctx->ctx);
        return LY_EINT;
    }

    LY_CHECK_RET(lyb_write_number(str_len, len_size, out, lybctx));

    LY_CHECK_RET(lyb_write(out, (const uint8_t *)str, str_len, lybctx));

    return LY_SUCCESS;
}